

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadQuaternion(OgreBinarySerializer *this,aiQuaternion *quat)

{
  undefined4 local_28;
  undefined4 local_24;
  float temp [4];
  aiQuaternion *quat_local;
  OgreBinarySerializer *this_local;
  
  temp._8_8_ = quat;
  StreamReader<false,_false>::CopyAndAdvance(this->m_reader,&local_28,0x10);
  *(undefined4 *)(temp._8_8_ + 4) = local_28;
  *(undefined4 *)(temp._8_8_ + 8) = local_24;
  *(float *)(temp._8_8_ + 0xc) = temp[0];
  *(float *)temp._8_8_ = temp[1];
  return;
}

Assistant:

void OgreBinarySerializer::ReadQuaternion(aiQuaternion &quat)
{
    float temp[4];
    m_reader->CopyAndAdvance(temp, sizeof(float)*4);
    quat.x = temp[0];
    quat.y = temp[1];
    quat.z = temp[2];
    quat.w = temp[3];
}